

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O1

QString * QStyleHelper::uniqueName
                    (QString *__return_storage_ptr__,QString *key,QStyleOption *option,QSize *size,
                    qreal dpr)

{
  Int IVar1;
  LayoutDirection LVar2;
  QWidget *pQVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  QStyleOption *pQVar8;
  QWidget *this;
  uint uVar9;
  long in_FS_OFFSET;
  QString local_98;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<double>_>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QWidget *)option->styleObject;
  if (pQVar3 == (QWidget *)0x0) {
    this = (QWidget *)0x0;
  }
  else {
    this = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0) {
      this = pQVar3;
    }
  }
  if ((this == (QWidget *)0x0) ||
     (bVar7 = QWidget::testAttribute_helper(this,WA_StyleSheetTarget), !bVar7)) {
    if ((option == (QStyleOption *)0x0) ||
       ((option->version < 1 || (pQVar8 = option, option->type < 0xf0000)))) {
      pQVar8 = (QStyleOption *)0x0;
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    IVar1 = (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    LVar2 = option->direction;
    if (pQVar8 == (QStyleOption *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = pQVar8[1].type;
    }
    local_78.a.a.a.b.val = QPalette::cacheKey();
    local_78.a.a.b.val = (size->wd).m_i;
    local_78.a.b.val = (size->ht).m_i;
    local_78.a.a.a.a.a.a.a = key;
    local_78.a.a.a.a.a.a.b.val = IVar1;
    local_78.a.a.a.a.a.b.val = LVar2;
    local_78.a.a.a.a.b.val = uVar9;
    local_78.b.val = dpr;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<double>_>
    ::convertTo<QString>(__return_storage_ptr__,&local_78);
    if (((option == (QStyleOption *)0x0) || (option->version < 1)) || (option->type != 0xf0002)) {
      option = (QStyleOption *)0x0;
    }
    if (option != (QStyleOption *)0x0) {
      local_78.a.a.a.a.a.a.b.val =
           option[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i;
      local_78.a.a.a.a.a.b.val = option[1].direction;
      local_78.a.a.a.a.b.val =
           CONCAT22(local_78.a.a.a.a.b.val._2_2_,(ushort)(byte)option[1].rect.x1.m_i) | 0x30;
      local_78.a.a.a.a.a.a.a = __return_storage_ptr__;
      QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_QChar>
      ::convertTo<QString>
                (&local_98,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_QChar>
                  *)&local_78);
      pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar5 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_98.d.d;
      (__return_storage_ptr__->d).ptr = local_98.d.ptr;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_98.d.size;
      local_98.d.d = (Data *)pQVar4;
      local_98.d.ptr = pcVar5;
      local_98.d.size = qVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0034fa8b;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0034fa8b:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString uniqueName(const QString &key, const QStyleOption *option, const QSize &size, qreal dpr)
{
    if (!usePixmapCache(option))
        return {};

    const QStyleOptionComplex *complexOption = qstyleoption_cast<const QStyleOptionComplex *>(option);
    QString tmp = key % HexString<uint>(option->state)
                      % HexString<uint>(option->direction)
                      % HexString<uint>(complexOption ? uint(complexOption->activeSubControls) : 0u)
                      % HexString<quint64>(option->palette.cacheKey())
                      % HexString<uint>(size.width())
                      % HexString<uint>(size.height())
                      % HexString<qreal>(dpr);

#if QT_CONFIG(spinbox)
    if (const QStyleOptionSpinBox *spinBox = qstyleoption_cast<const QStyleOptionSpinBox *>(option)) {
        tmp = tmp % HexString<uint>(spinBox->buttonSymbols)
                  % HexString<uint>(spinBox->stepEnabled)
                  % QChar(spinBox->frame ? u'1' : u'0');
    }
#endif // QT_CONFIG(spinbox)

    return tmp;
}